

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O2

void std::
     __move_median_to_first<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoRange,embree::sse2::BinSplit<32ul>>*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoRange,embree::sse2::BinSplit<32ul>>>>>
               (BuildRecordT<embree::sse2::PrimInfoRange,_embree::sse2::BinSplit<32UL>_> *__result,
               BuildRecordT<embree::sse2::PrimInfoRange,_embree::sse2::BinSplit<32UL>_> *__a,
               BuildRecordT<embree::sse2::PrimInfoRange,_embree::sse2::BinSplit<32UL>_> *__b,
               BuildRecordT<embree::sse2::PrimInfoRange,_embree::sse2::BinSplit<32UL>_> *__c)

{
  BuildRecordT<embree::sse2::PrimInfoRange,_embree::sse2::BinSplit<32UL>_> *__b_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (__a->prims).super_range<unsigned_long>._end -
          (__a->prims).super_range<unsigned_long>._begin;
  uVar3 = (__b->prims).super_range<unsigned_long>._end -
          (__b->prims).super_range<unsigned_long>._begin;
  uVar2 = (__c->prims).super_range<unsigned_long>._end -
          (__c->prims).super_range<unsigned_long>._begin;
  if (uVar3 < uVar1) {
    __b_00 = __b;
    if ((uVar3 <= uVar2) && (__b_00 = __a, uVar2 < uVar1)) {
      __b_00 = __c;
    }
  }
  else {
    __b_00 = __a;
    if ((uVar1 <= uVar2) && (__b_00 = __b, uVar2 < uVar3)) {
      __b_00 = __c;
    }
  }
  swap<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoRange,embree::sse2::BinSplit<32ul>>>
            (__result,__b_00);
  return;
}

Assistant:

__forceinline Ty size() const {
        return _end - _begin;
      }